

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int ptls_server_name_is_ipaddr(char *name)

{
  int iVar1;
  uint uVar2;
  sockaddr_in sin;
  sockaddr_in6 sin6;
  undefined1 local_34 [16];
  undefined1 local_24 [28];
  
  iVar1 = inet_pton(2,name,local_34);
  uVar2 = 1;
  if (iVar1 != 1) {
    iVar1 = inet_pton(10,name,local_24);
    uVar2 = (uint)(iVar1 == 1);
  }
  return uVar2;
}

Assistant:

int ptls_server_name_is_ipaddr(const char *name)
{
#ifdef AF_INET
    struct sockaddr_in sin;
    if (inet_pton(AF_INET, name, &sin) == 1)
        return 1;
#endif
#ifdef AF_INET6
    struct sockaddr_in6 sin6;
    if (inet_pton(AF_INET6, name, &sin6) == 1)
        return 1;
#endif
    return 0;
}